

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitview.c
# Opt level: O2

void drawScene(void)

{
  double __x;
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  GLfloat model_specular [4];
  GLfloat model_diffuse [4];
  
  model_diffuse[0] = 1.0;
  model_diffuse[1] = 0.8;
  model_diffuse[2] = 0.8;
  model_diffuse[3] = 1.0;
  model_specular[0] = 0.6;
  model_specular[1] = 0.6;
  model_specular[2] = 0.6;
  model_specular[3] = 1.0;
  glPushMatrix();
  glRotatef((float)rot_x * 0.5,0x3f800000,0,0);
  glRotatef((float)rot_y * 0.5,0,0x3f800000,0);
  glRotatef((float)rot_z * 0.5,0,0,0x3f800000);
  glColor4fv(model_diffuse);
  glMaterialfv(0x404,0x1201,model_diffuse);
  glMaterialfv(0x404,0x1202,model_specular);
  glMaterialf(0x41a00000,0x404,0x1601);
  if (drawTorus_torus_list == 0) {
    drawTorus_torus_list = glGenLists(1);
    glNewList(drawTorus_torus_list,0x1301);
    for (iVar5 = 0; iVar5 != 0x20; iVar5 = iVar5 + 1) {
      glBegin(8);
      for (uVar6 = 0; uVar6 != 0x21; uVar6 = uVar6 + 1) {
        __x = (double)(uVar6 & 0x1f) * 6.283185307179586 * 0.03125;
        for (iVar4 = 1; -1 < iVar4; iVar4 = iVar4 + -1) {
          dVar7 = ((double)(iVar5 + iVar4 & 0x1f) + 0.5) * 6.283185307179586 * 0.03125;
          dVar1 = cos(dVar7);
          dVar2 = cos(__x);
          dVar2 = dVar2 * (dVar1 * 0.5 + 1.5);
          dVar1 = sin(dVar7);
          dVar1 = dVar1 * 0.5;
          dVar7 = cos(dVar7);
          dVar3 = sin(__x);
          dVar3 = dVar3 * (dVar7 * 0.5 + 1.5);
          dVar7 = cos(__x);
          dVar8 = dVar7 * -1.5 + dVar2;
          dVar7 = sin(__x);
          dVar7 = dVar7 * -1.5 + dVar3;
          dVar9 = 1.0 / SQRT(dVar7 * dVar7 + dVar8 * dVar8 + dVar1 * dVar1);
          glNormal3f((float)(dVar8 * dVar9),
                     CONCAT44((int)((ulong)(dVar1 * dVar9) >> 0x20),(float)(dVar1 * dVar9)),
                     CONCAT44((int)((ulong)(dVar9 * dVar7) >> 0x20),(float)(dVar9 * dVar7)));
          glVertex3f((float)dVar2,(float)dVar1,(float)dVar3);
        }
      }
      glEnd();
    }
    glEndList();
  }
  else {
    glCallList();
  }
  glPopMatrix();
  return;
}

Assistant:

static void drawScene(void)
{
    const GLfloat model_diffuse[4]  = {1.0f, 0.8f, 0.8f, 1.0f};
    const GLfloat model_specular[4] = {0.6f, 0.6f, 0.6f, 1.0f};
    const GLfloat model_shininess   = 20.0f;

    glPushMatrix();

    // Rotate the object
    glRotatef((GLfloat) rot_x * 0.5f, 1.0f, 0.0f, 0.0f);
    glRotatef((GLfloat) rot_y * 0.5f, 0.0f, 1.0f, 0.0f);
    glRotatef((GLfloat) rot_z * 0.5f, 0.0f, 0.0f, 1.0f);

    // Set model color (used for orthogonal views, lighting disabled)
    glColor4fv(model_diffuse);

    // Set model material (used for perspective view, lighting enabled)
    glMaterialfv(GL_FRONT, GL_DIFFUSE, model_diffuse);
    glMaterialfv(GL_FRONT, GL_SPECULAR, model_specular);
    glMaterialf(GL_FRONT, GL_SHININESS, model_shininess);

    // Draw torus
    drawTorus();

    glPopMatrix();
}